

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

prf_node_t * prf_node_clone(prf_node_t *node,prf_model_t *source,prf_model_t *target)

{
  pool_t pool_id;
  uint uVar1;
  prf_nodeinfo_t *ppVar2;
  prf_node_t *ppVar3;
  uint8_t *puVar4;
  uint uVar5;
  
  ppVar2 = prf_nodeinfo_get(node->opcode);
  if ((ppVar2 != (prf_nodeinfo_t *)0x0) &&
     (ppVar2->clone_f != (_func_prf_node_t_ptr_prf_node_t_ptr_prf_model_t_ptr_prf_model_t_ptr *)0x0)
     ) {
    ppVar3 = (*ppVar2->clone_f)(node,source,target);
    return ppVar3;
  }
  if (target->mempool_id == 0) {
    ppVar3 = (prf_node_t *)malloc(0x28);
    if (ppVar3 == (prf_node_t *)0x0) goto LAB_00106955;
    *(undefined8 *)((long)&ppVar3->children + 4) = 0;
    *(undefined8 *)((long)&ppVar3->parent + 4) = 0;
    *(undefined8 *)&ppVar3->flags = 0;
    *(undefined8 *)((long)&ppVar3->data + 4) = 0;
    *(undefined4 *)((long)&ppVar3->userdata + 4) = 0;
    uVar5._0_2_ = node->opcode;
    uVar5._2_2_ = node->length;
    ppVar3->opcode = (undefined2)uVar5;
    ppVar3->length = uVar5._2_2_;
    uVar5 = uVar5 >> 0x10;
LAB_00106925:
    if ((ushort)uVar5 < 5) goto LAB_0010693f;
    puVar4 = (uint8_t *)malloc((ulong)(uVar5 - 4));
    ppVar3->data = puVar4;
  }
  else {
    ppVar3 = (prf_node_t *)pool_malloc(target->mempool_id,0x28);
    if (ppVar3 == (prf_node_t *)0x0) {
LAB_00106955:
      prf_error(9,"memory allocation failure (returned NULL)");
      return (prf_node_t *)0x0;
    }
    ppVar3->opcode = 0;
    ppVar3->length = 4;
    *(undefined8 *)&ppVar3->flags = 0;
    *(undefined8 *)((long)&ppVar3->data + 4) = 0;
    *(undefined8 *)((long)&ppVar3->children + 4) = 0;
    *(undefined8 *)((long)&ppVar3->parent + 4) = 0;
    *(undefined4 *)((long)&ppVar3->userdata + 4) = 0;
    pool_id = target->mempool_id;
    uVar1._0_2_ = node->opcode;
    uVar1._2_2_ = node->length;
    ppVar3->opcode = (undefined2)uVar1;
    ppVar3->length = uVar1._2_2_;
    uVar5 = uVar1 >> 0x10;
    if (pool_id == 0) goto LAB_00106925;
    ppVar3->flags = 0x100;
    if ((ushort)uVar1._2_2_ < 5) goto LAB_0010693f;
    puVar4 = (uint8_t *)pool_malloc(pool_id,uVar5 - 4);
    ppVar3->data = puVar4;
    uVar5 = (uint)node->length;
    if (node->length < 5) goto LAB_0010693f;
  }
  if (puVar4 == (uint8_t *)0x0) {
    prf_error(9,"memory allocation failure (returned NULL)");
    if (target->mempool_id == 0) {
      free(ppVar3);
    }
    return (prf_node_t *)0x0;
  }
LAB_0010693f:
  memcpy(ppVar3->data,node->data,(ulong)uVar5 - 4);
  return ppVar3;
}

Assistant:

prf_node_t *
prf_node_clone(
    prf_node_t * node,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_nodeinfo_t * info;

    assert( node != NULL && target != NULL );

    info = prf_nodeinfo_get( node->opcode );
    if ( info != NULL && info->clone_f != NULL ) {
        return (*(info->clone_f))( node, source, target );
    } else {
        prf_node_t * newnode;
        if ( target->mempool_id == 0 ) {
            newnode = prf_node_create();
        } else {
            newnode = (prf_node_t *)pool_malloc( target->mempool_id, 
						 sizeof( prf_node_t ) );
            prf_node_clear( newnode );
        }
        if ( newnode == NULL ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            return NULL;
        }
        newnode->opcode = node->opcode;
        newnode->length = node->length;
        if ( target->mempool_id != 0 )
            newnode->flags |= PRF_NODE_MEMPOOLED;
        if ( (node->length > 4) && (target->mempool_id == 0) )
            newnode->data = (uint8_t *)malloc( node->length - 4 );
        else if ( node->length > 4 )
            newnode->data = (uint8_t *)pool_malloc( target->mempool_id, 
						    node->length - 4 );
        if ( (node->length > 4) && (newnode->data == NULL) ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            if ( target->mempool_id == 0 )
                free( newnode );
            return NULL;
        }
        memcpy( newnode->data, node->data, node->length - 4 );
        return newnode;
    }
}